

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::int_writer<char,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this)

{
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  num_writer f;
  char cVar1;
  uint uVar2;
  pointer lp;
  string_view prefix;
  undefined4 local_38;
  uint size;
  char_type sep;
  uint num_digits;
  int_writer<char,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  uVar2 = internal::count_digits(this->abs_value);
  lp = std::unique_ptr<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>::
       get(&this->writer->locale_);
  cVar1 = internal::thousands_sep<char>(lp);
  uVar2 = uVar2 + (uVar2 - 1) / 3;
  this_00 = this->writer;
  prefix = get_prefix(this);
  local_38 = CONCAT31(local_38._1_3_,cVar1);
  f.size = uVar2;
  f.abs_value = this->abs_value;
  f._8_4_ = local_38;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this_00,uVar2,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      unsigned num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_.get());
      unsigned size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }